

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::Generator::
ModuleLevelDescriptorName<google::protobuf::Descriptor>
          (string *__return_storage_ptr__,Generator *this,Descriptor *descriptor)

{
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"_",(allocator<char> *)&local_60);
  anon_unknown_0::NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (__return_storage_ptr__,descriptor,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  UpperString(__return_storage_ptr__);
  std::operator+(&local_80,"_",__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (*(FileDescriptor **)(descriptor + 0x10) != this->file_) {
    anon_unknown_0::ModuleName(&local_40,*(string **)*(FileDescriptor **)(descriptor + 0x10));
    std::operator+(&local_60,&local_40,".");
    std::operator+(&local_80,&local_60,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

string Generator::ModuleLevelDescriptorName(
    const DescriptorT& descriptor) const {
  // FIXME(robinson):
  // We currently don't worry about collisions with underscores in the type
  // names, so these would collide in nasty ways if found in the same file:
  //   OuterProto.ProtoA.ProtoB
  //   OuterProto_ProtoA.ProtoB  # Underscore instead of period.
  // As would these:
  //   OuterProto.ProtoA_.ProtoB
  //   OuterProto.ProtoA._ProtoB  # Leading vs. trailing underscore.
  // (Contrived, but certainly possible).
  //
  // The C++ implementation doesn't guard against this either.  Leaving
  // it for now...
  string name = NamePrefixedWithNestedTypes(descriptor, "_");
  UpperString(&name);
  // Module-private for now.  Easy to make public later; almost impossible
  // to make private later.
  name = "_" + name;
  // We now have the name relative to its own module.  Also qualify with
  // the module name iff this descriptor is from a different .proto file.
  if (descriptor.file() != file_) {
    name = ModuleName(descriptor.file()->name()) + "." + name;
  }
  return name;
}